

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_index_list.cpp
# Opt level: O1

bool __thiscall duckdb::TableIndexList::NameIsUnique(TableIndexList *this,string *name)

{
  pointer puVar1;
  size_t __n;
  int iVar2;
  pointer pIVar3;
  undefined4 extraout_var;
  unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true> *index;
  pointer this_00;
  bool bVar4;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar2 != 0) {
    ::std::__throw_system_error(iVar2);
  }
  puVar1 = (this->indexes).
           super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (this->indexes).
                 super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; bVar4 = this_00 == puVar1, !bVar4;
      this_00 = this_00 + 1) {
    pIVar3 = unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>::operator->
                       (this_00);
    iVar2 = (*pIVar3->_vptr_Index[5])(pIVar3);
    if ((char)iVar2 == '\x02') {
LAB_017e978f:
      pIVar3 = unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>::operator->
                         (this_00);
      iVar2 = (*pIVar3->_vptr_Index[4])(pIVar3);
      __n = ((undefined8 *)CONCAT44(extraout_var,iVar2))[1];
      if (__n == name->_M_string_length) {
        if (__n == 0) break;
        iVar2 = bcmp(*(void **)CONCAT44(extraout_var,iVar2),(name->_M_dataplus)._M_p,__n);
        if (iVar2 == 0) break;
      }
    }
    else {
      pIVar3 = unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>::operator->
                         (this_00);
      iVar2 = (*pIVar3->_vptr_Index[5])(pIVar3);
      if ((char)iVar2 == '\x03') goto LAB_017e978f;
      pIVar3 = unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>::operator->
                         (this_00);
      iVar2 = (*pIVar3->_vptr_Index[5])(pIVar3);
      if ((byte)((char)iVar2 - 1U) < 2) goto LAB_017e978f;
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return bVar4;
}

Assistant:

bool TableIndexList::NameIsUnique(const string &name) {
	lock_guard<mutex> lock(indexes_lock);

	// Only covers PK, FK, and UNIQUE indexes.
	for (const auto &index : indexes) {
		if (index->IsPrimary() || index->IsForeign() || index->IsUnique()) {
			if (index->GetIndexName() == name) {
				return false;
			}
		}
	}
	return true;
}